

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeNEONModImmInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint RegNo;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  DecodeStatus DVar8;
  uint uVar9;
  uint Rd;
  uint Q;
  uint imm;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Q = 3;
  _imm = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x16,1);
  RegNo = uVar3 << 4 | uVar2;
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x10,3);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0x18,1);
  uVar5 = fieldFromInstruction_4(Address_local._4_4_,8,4);
  uVar6 = fieldFromInstruction_4(Address_local._4_4_,5,1);
  uVar7 = fieldFromInstruction_4(Address_local._4_4_,6,1);
  if (uVar7 == 0) {
    DVar8 = DecodeDPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_imm);
    _Var1 = Check(&Q,DVar8);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  else {
    DVar8 = DecodeQPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_imm);
    _Var1 = Check(&Q,DVar8);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  MCOperand_CreateImm0
            (pMStack_18,(ulong)(uVar6 << 0xc | uVar5 << 8 | uVar4 << 7 | uVar3 << 4 | uVar2));
  uVar9 = MCInst_getOpcode(pMStack_18);
  if (uVar9 - 599 < 2) {
LAB_00167860:
    DVar8 = DecodeDPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_imm);
    _Var1 = Check(&Q,DVar8);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  else {
    if (1 < uVar9 - 0x259) {
      if (uVar9 - 0x5a2 < 2) goto LAB_00167860;
      if (1 < uVar9 - 0x5a4) {
        return Q;
      }
    }
    DVar8 = DecodeQPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_imm);
    _Var1 = Check(&Q,DVar8);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  return Q;
}

Assistant:

static DecodeStatus DecodeNEONModImmInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned imm, Q;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	imm = fieldFromInstruction_4(Insn, 0, 4);
	imm |= fieldFromInstruction_4(Insn, 16, 3) << 4;
	imm |= fieldFromInstruction_4(Insn, 24, 1) << 7;
	imm |= fieldFromInstruction_4(Insn, 8, 4) << 8;
	imm |= fieldFromInstruction_4(Insn, 5, 1) << 12;
	Q = fieldFromInstruction_4(Insn, 6, 1);

	if (Q) {
		if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	} else {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	MCOperand_CreateImm0(Inst, imm);

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VORRiv4i16:
		case ARM_VORRiv2i32:
		case ARM_VBICiv4i16:
		case ARM_VBICiv2i32:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VORRiv8i16:
		case ARM_VORRiv4i32:
		case ARM_VBICiv8i16:
		case ARM_VBICiv4i32:
			if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}